

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawStringProp
          (PixelGameEngine *this,int32_t x,int32_t y,string *sText,Pixel col,uint32_t scale)

{
  Mode MVar1;
  int iVar2;
  Pixel PVar3;
  int iVar4;
  short sVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  int32_t is;
  uint32_t uVar11;
  int iVar12;
  uint32_t uVar13;
  long lVar14;
  int32_t j;
  uint32_t uVar15;
  int iVar16;
  uint uVar17;
  bool bVar18;
  uint local_bc;
  
  MVar1 = this->nPixelMode;
  if (MVar1 != CUSTOM) {
    this->nPixelMode = ((uint)col.field_0 < 0xff000000) + MASK;
  }
  pcVar10 = (sText->_M_dataplus)._M_p;
  pcVar7 = pcVar10 + sText->_M_string_length;
  iVar12 = 0;
  uVar13 = 0;
  if (0 < (int)scale) {
    uVar13 = scale;
  }
  iVar4 = 0;
  for (; pcVar10 != pcVar7; pcVar10 = pcVar10 + 1) {
    lVar14 = (long)*pcVar10;
    if (lVar14 == 10) {
      iVar12 = iVar12 + scale * 8;
      iVar4 = 0;
    }
    else {
      sVar5 = *pcVar10 + -0x20;
      iVar2 = (sVar5 % 0x10) * 8;
      uVar8 = (sVar5 / 0x10) * 8;
      if (scale < 2) {
        iVar6 = 0;
        while( true ) {
          iVar16 = (this->vFontSpacing).
                   super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar14 + -0x20].y;
          if (iVar16 <= iVar6) break;
          for (iVar16 = 0; iVar16 != 8; iVar16 = iVar16 + 1) {
            PVar3 = Sprite::GetPixel(this->fontSprite,
                                     (this->vFontSpacing).
                                     super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar14 + -0x20].x +
                                     iVar6 + iVar2,uVar8 + iVar16);
            if (PVar3.field_0._0_1_ != '\0') {
              (*this->_vptr_PixelGameEngine[5])
                        (this,(ulong)(uint)(x + iVar4 + iVar6),(ulong)(uint)(y + iVar12 + iVar16),
                         col.field_0);
            }
          }
          iVar6 = iVar6 + 1;
        }
      }
      else {
        iVar6 = 0;
        while( true ) {
          iVar16 = (this->vFontSpacing).
                   super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar14 + -0x20].y;
          if (iVar16 <= iVar6) break;
          local_bc = y + iVar12;
          for (uVar9 = 0; uVar9 != 8; uVar9 = uVar9 + 1) {
            PVar3 = Sprite::GetPixel(this->fontSprite,
                                     (this->vFontSpacing).
                                     super__Vector_base<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar14 + -0x20].x +
                                     iVar2 + iVar6,uVar9 | uVar8);
            if (PVar3.field_0._0_1_ != '\0') {
              for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
                uVar17 = local_bc;
                uVar15 = scale;
                while (bVar18 = uVar15 != 0, uVar15 = uVar15 - 1, bVar18) {
                  (*this->_vptr_PixelGameEngine[5])
                            (this,(ulong)(iVar6 * scale + x + iVar4 + uVar11),(ulong)uVar17,
                             col.field_0);
                  uVar17 = uVar17 + 1;
                }
              }
            }
            local_bc = local_bc + scale;
          }
          iVar6 = iVar6 + 1;
        }
      }
      iVar4 = iVar16 * scale + iVar4;
    }
  }
  this->nPixelMode = MVar1;
  return;
}

Assistant:

void PixelGameEngine::DrawStringProp(int32_t x, int32_t y, const std::string &sText, Pixel col, uint32_t scale)
	{
		int32_t sx = 0;
		int32_t sy = 0;
		Pixel::Mode m = nPixelMode;

		if (m != Pixel::CUSTOM)
		{
			if (col.a != 255)
				SetPixelMode(Pixel::ALPHA);
			else
				SetPixelMode(Pixel::MASK);
		}
		for (auto c : sText)
		{
			if (c == '\n')
			{
				sx = 0;
				sy += 8 * scale;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;

				if (scale > 1)
				{
					for (int32_t i = 0; i < vFontSpacing[c - 32].y; i++)
						for (int32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8 + vFontSpacing[c - 32].x, j + oy * 8).r > 0)
								for (int32_t is = 0; is < int(scale); is++)
									for (int32_t js = 0; js < int(scale); js++)
										Draw(x + sx + (i * scale) + is, y + sy + (j * scale) + js, col);
				}
				else
				{
					for (int32_t i = 0; i < vFontSpacing[c - 32].y; i++)
						for (int32_t j = 0; j < 8; j++)
							if (fontSprite->GetPixel(i + ox * 8 + vFontSpacing[c - 32].x, j + oy * 8).r > 0)
								Draw(x + sx + i, y + sy + j, col);
				}
				sx += vFontSpacing[c - 32].y * scale;
			}
		}
		SetPixelMode(m);
	}